

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int s_mp_sqr(mp_int *a,mp_int *b)

{
  ulong *puVar1;
  uint uVar2;
  mp_digit mVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  mp_digit *pmVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint size;
  ulong *puVar19;
  mp_int t;
  mp_int local_68;
  mp_int *local_50;
  mp_int local_48;
  
  uVar2 = a->used;
  uVar18 = (ulong)uVar2;
  size = uVar2 * 2 + 1;
  iVar10 = mp_init_size(&local_68,size);
  if (iVar10 == 0) {
    local_68.used = size;
    if (0 < (int)uVar2) {
      pmVar14 = a->dp;
      uVar16 = 1;
      uVar17 = 0;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pmVar14[uVar17];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pmVar14[uVar17];
        uVar11 = SUB168(auVar4 * auVar6,0);
        puVar1 = local_68.dp + uVar17 * 2;
        puVar19 = puVar1 + 1;
        uVar12 = uVar11 + *puVar1;
        uVar11 = (SUB168(auVar4 * auVar6,8) + (ulong)CARRY8(uVar11,*puVar1)) * 0x10 | uVar12 >> 0x3c
        ;
        *puVar1 = uVar12 & 0xfffffffffffffff;
        uVar12 = uVar17 + 1;
        if (uVar12 < uVar18) {
          mVar3 = pmVar14[uVar17];
          uVar17 = uVar16;
          do {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = mVar3 * 2;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = pmVar14[uVar17];
            uVar13 = SUB168(auVar5 * auVar7,0);
            uVar15 = uVar11 + *puVar19 + uVar13;
            uVar11 = ((ulong)CARRY8(uVar11,*puVar19) +
                      SUB168(auVar5 * auVar7,8) + -((long)mVar3 >> 0x3f) * pmVar14[uVar17] +
                     (ulong)CARRY8(uVar11 + *puVar19,uVar13)) * 0x10 | uVar15 >> 0x3c;
            *puVar19 = uVar15 & 0xfffffffffffffff;
            puVar19 = puVar19 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        for (; uVar11 != 0; uVar11 = uVar11 + uVar13 >> 0x3c | (ulong)CARRY8(uVar11,uVar17) << 4) {
          uVar17 = *puVar19;
          uVar13 = *puVar19;
          *puVar19 = uVar11 + uVar13 & 0xfffffffffffffff;
          puVar19 = puVar19 + 1;
        }
        uVar16 = uVar16 + 1;
        uVar17 = uVar12;
      } while (uVar12 != uVar18);
    }
    if (-1 < (int)uVar2) {
      if (local_68.dp[(ulong)size - 1] == 0) {
        pmVar14 = local_68.dp + uVar2 * 2;
        uVar2 = uVar2 * 2;
        do {
          size = uVar2;
          pmVar14 = pmVar14 + -1;
          if ((int)(size + 1) < 2) {
            local_68.used = size;
            local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
            goto LAB_00105035;
          }
          uVar2 = size - 1;
        } while (*pmVar14 == 0);
      }
      local_68.used = size;
    }
LAB_00105035:
    local_48.dp = local_68.dp;
    local_48.used = local_68.used;
    local_48.alloc = local_68.alloc;
    local_48.sign = local_68.sign;
    local_48._12_4_ = local_68._12_4_;
    pmVar14 = b->dp;
    uVar8._0_4_ = b->used;
    uVar8._4_4_ = b->alloc;
    uVar9._0_4_ = b->sign;
    uVar9._4_4_ = *(undefined4 *)&b->field_0xc;
    b->used = local_68.used;
    b->alloc = local_68.alloc;
    b->sign = local_68.sign;
    *(undefined4 *)&b->field_0xc = local_68._12_4_;
    b->dp = local_68.dp;
    iVar10 = 0;
    if (pmVar14 != (mp_digit *)0x0) {
      local_68._0_8_ = uVar8;
      local_68._8_8_ = uVar9;
      local_68.dp = pmVar14;
      local_50 = b;
      free(pmVar14);
    }
  }
  return iVar10;
}

Assistant:

int s_mp_sqr (mp_int * a, mp_int * b)
{
  mp_int  t;
  int     res, ix, iy, pa;
  mp_word r;
  mp_digit u, tmpx, *tmpt;

  pa = a->used;
  if ((res = mp_init_size (&t, 2*pa + 1)) != MP_OKAY) {
    return res;
  }

  /* default used is maximum possible size */
  t.used = 2*pa + 1;

  for (ix = 0; ix < pa; ix++) {
    /* first calculate the digit at 2*ix */
    /* calculate double precision result */
    r = ((mp_word) t.dp[2*ix]) +
        ((mp_word)a->dp[ix])*((mp_word)a->dp[ix]);

    /* store lower part in result */
    t.dp[ix+ix] = (mp_digit) (r & ((mp_word) MP_MASK));

    /* get the carry */
    u           = (mp_digit)(r >> ((mp_word) DIGIT_BIT));

    /* left hand side of A[ix] * A[iy] */
    tmpx        = a->dp[ix];

    /* alias for where to store the results */
    tmpt        = t.dp + (2*ix + 1);
    
    for (iy = ix + 1; iy < pa; iy++) {
      /* first calculate the product */
      r       = ((mp_word)tmpx) * ((mp_word)a->dp[iy]);

      /* now calculate the double precision result, note we use
       * addition instead of *2 since it's easier to optimize
       */
      r       = ((mp_word) *tmpt) + r + r + ((mp_word) u);

      /* store lower part */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get carry */
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
    /* propagate upwards */
    while (u != ((mp_digit) 0)) {
      r       = ((mp_word) *tmpt) + ((mp_word) u);
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
  }

  mp_clamp (&t);
  mp_exch (&t, b);
  mp_clear (&t);
  return MP_OKAY;
}